

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingMate::ComputeForceTorque
          (ChLoadXYZROTnodeBodyBushingMate *this,ChFrameMoving<double> *rel_AB,
          ChVector<double> *loc_force,ChVector<double> *loc_torque)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double local_38;
  double local_30;
  double local_28;
  
  ChLoadXYZROTnodeBodyBushingSpherical::ComputeForceTorque
            (&this->super_ChLoadXYZROTnodeBodyBushingSpherical,rel_AB,loc_force,loc_torque);
  dVar8 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar8;
  dVar13 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[2];
  dVar5 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar5;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar13 * dVar13;
  auVar11 = vfmadd231sd_fma(auVar11,auVar14,auVar14);
  auVar11 = vfmadd231sd_fma(auVar11,auVar18,auVar18);
  dVar16 = 0.0;
  dVar9 = auVar11._0_8_;
  if (dVar9 <= 0.0) {
    dVar5 = 1.0;
    dVar8 = 0.0;
    auVar15 = ZEXT816(0);
  }
  else {
    dVar16 = (rel_AB->super_ChFrame<double>).coord.rot.m_data[0];
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      auVar11 = vsqrtsd_avx(auVar11,auVar11);
      dVar9 = auVar11._0_8_;
    }
    dVar16 = atan2(dVar9,dVar16);
    dVar9 = 1.0 / dVar9;
    dVar8 = dVar9 * dVar8;
    dVar13 = dVar9 * dVar13;
    dVar9 = dVar9 * dVar5;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar13 * dVar13;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar8;
    auVar11 = vfmadd231sd_fma(auVar12,auVar17,auVar17);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar9;
    auVar11 = vfmadd231sd_fma(auVar11,auVar19,auVar19);
    if (auVar11._0_8_ < 0.0) {
      dVar10 = sqrt(auVar11._0_8_);
    }
    else {
      auVar11 = vsqrtsd_avx(auVar11,auVar11);
      dVar10 = auVar11._0_8_;
    }
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar16 + dVar16;
    bVar4 = 2.2250738585072014e-308 <= dVar10;
    dVar10 = 1.0 / dVar10;
    dVar5 = (double)((ulong)bVar4 * (long)(dVar8 * dVar10) + (ulong)!bVar4 * 0x3ff0000000000000);
    dVar16 = (double)((ulong)bVar4 * (long)(dVar13 * dVar10));
    dVar8 = (double)((ulong)bVar4 * (long)(dVar9 * dVar10));
  }
  dVar13 = auVar15._0_8_;
  if (dVar13 <= 3.141592653589793) {
    if (dVar13 < -3.141592653589793) {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar13 + 6.283185307179586;
    }
  }
  else {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar13 + -6.283185307179586;
  }
  uVar3 = vcmpsd_avx512f(auVar15,ZEXT816(0x400921fb54442d18),0xe);
  bVar4 = (bool)((byte)uVar3 & 1);
  auVar7._0_8_ = (double)((ulong)bVar4 * (long)(auVar15._0_8_ + -6.283185307179586) +
                         (ulong)!bVar4 * (long)auVar15._0_8_);
  auVar7._8_8_ = auVar15._8_8_;
  uVar3 = vcmpsd_avx512f(auVar7,ZEXT816(0xc00921fb54442d18),1);
  bVar4 = (bool)((byte)uVar3 & 1);
  dVar6 = (double)((ulong)bVar4 * (long)(auVar7._0_8_ + 6.283185307179586) +
                  (ulong)!bVar4 * (long)auVar7._0_8_);
  dVar13 = (this->rot_stiffness).m_data[2];
  dVar9 = (this->rot_stiffness).m_data[1];
  dVar10 = (this->rot_stiffness).m_data[0];
  ChFrameMoving<double>::GetWvel_par(rel_AB);
  dVar1 = (this->rot_damping).m_data[2];
  dVar2 = (this->rot_damping).m_data[1];
  loc_torque->m_data[0] = local_38 * (this->rot_damping).m_data[0] + dVar5 * dVar6 * dVar10;
  loc_torque->m_data[1] = local_30 * dVar2 + dVar16 * dVar6 * dVar9;
  loc_torque->m_data[2] = local_28 * dVar1 + dVar8 * dVar6 * dVar13;
  return;
}

Assistant:

void ChLoadXYZROTnodeBodyBushingMate::ComputeForceTorque(const ChFrameMoving<>& rel_AB,
                                                         ChVector<>& loc_force,
                                                         ChVector<>& loc_torque) {
    // inherit parent to compute loc_force = ...
    ChLoadXYZROTnodeBodyBushingSpherical::ComputeForceTorque(rel_AB, loc_force, loc_torque);

    // compute local torque using small rotations:
    ChQuaternion<> rel_rot = rel_AB.GetRot();

    ChVector<> dir_rot;
    double angle_rot;
    rel_rot.Q_to_AngAxis(angle_rot, dir_rot);
    if (angle_rot > CH_C_PI)
        angle_rot -= CH_C_2PI;
    if (angle_rot < -CH_C_PI)
        angle_rot += CH_C_2PI;
    ChVector<> vect_rot = dir_rot * angle_rot;

    loc_torque = vect_rot * rot_stiffness               // element-wise product!
                 + rel_AB.GetWvel_par() * rot_damping;  // element-wise product!
}